

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O3

void Validate(ChakraContext *ctx,bool isSpec)

{
  SpecContext *pSVar1;
  undefined8 *puVar2;
  char *pcVar3;
  
  if (ctx->createBuffer == (CreateBufferFn)0x0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar3 = "Missing createBuffer";
  }
  else {
    if (!isSpec) {
      return;
    }
    pSVar1 = ctx->spec;
    if (pSVar1 == (SpecContext *)0x0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar3 = "Missing Spec context";
    }
    else if (pSVar1->setProperty == (SetPropertyFn)0x0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar3 = "Missing spec->setProperty";
    }
    else if (pSVar1->int32ToVar == (Int32ToVarFn)0x0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar3 = "Missing spec->int32ToVar";
    }
    else if (pSVar1->int64ToVar == (Int64ToVarFn)0x0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar3 = "Missing spec->int64ToVar";
    }
    else if (pSVar1->stringToVar == (StringToVarFn)0x0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar3 = "Missing spec->stringToVar";
    }
    else if (pSVar1->createObject == (CreateObjectFn)0x0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar3 = "Missing spec->createObject";
    }
    else if (pSVar1->createArray == (CreateArrayFn)0x0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar3 = "Missing spec->createArray";
    }
    else {
      if (pSVar1->push != (PushFn)0x0) {
        return;
      }
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar3 = "Missing spec->push";
    }
  }
  *puVar2 = pcVar3;
  __cxa_throw(puVar2,&ChakraWabt::WabtAPIError::typeinfo,0);
}

Assistant:

void Validate(const ChakraContext& ctx, bool isSpec)
{
    if (!ctx.createBuffer) throw WabtAPIError("Missing createBuffer");
    if (isSpec)
    {
        if (!ctx.spec) throw WabtAPIError("Missing Spec context");
        if (!ctx.spec->setProperty) throw WabtAPIError("Missing spec->setProperty");
        if (!ctx.spec->int32ToVar) throw WabtAPIError("Missing spec->int32ToVar");
        if (!ctx.spec->int64ToVar) throw WabtAPIError("Missing spec->int64ToVar");
        if (!ctx.spec->stringToVar) throw WabtAPIError("Missing spec->stringToVar");
        if (!ctx.spec->createObject) throw WabtAPIError("Missing spec->createObject");
        if (!ctx.spec->createArray) throw WabtAPIError("Missing spec->createArray");
        if (!ctx.spec->push) throw WabtAPIError("Missing spec->push");
    }
}